

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O1

void __thiscall Kraken::KClient::~KClient(KClient *this)

{
  pointer pcVar1;
  
  curl_easy_cleanup(this->curl_);
  pcVar1 = (this->version_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->version_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->url_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->url_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->secret_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->secret_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->key_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->key_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

KClient::~KClient() 
{
   curl_easy_cleanup(curl_);
}